

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  undefined8 uVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 local_68 [16];
  undefined8 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  pIVar3 = GImGui;
  uVar7 = flags & 0x100000;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) &&
     (v_max - v_min < 3.4028234663852886e+38)) {
    dVar14 = (v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio;
    in_XMM0_Db = (undefined4)((ulong)dVar14 >> 0x20);
    v_speed = (float)dVar14;
    in_XMM0_Dc = 0;
    in_XMM0_Dd = 0;
  }
  uVar8 = data_type & 0xfffffffe;
  local_68._4_4_ = in_XMM0_Db;
  local_68._0_4_ = v_speed;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._12_4_ = in_XMM0_Dd;
  if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
    bVar4 = IsMousePosValid((ImVec2 *)0x0);
    if (!bVar4) goto LAB_00301a61;
    bVar4 = IsMouseDragPastThreshold(0,(pIVar3->IO).MouseDragThreshold * 0.5);
    if (!bVar4) goto LAB_00301a61;
    fVar9 = (pIVar3->IO).NavInputs[(ulong)(uVar7 >> 0x14) + 0x1c];
    bVar4 = (pIVar3->IO).KeyShift;
    bVar1 = (pIVar3->IO).KeyAlt;
    fVar9 = (float)((uint)(bVar1 & 1) * (int)(fVar9 * 0.01) + (uint)!(bool)(bVar1 & 1) * (int)fVar9)
    ;
    fVar9 = (float)((uint)(bVar4 & 1) * (int)(fVar9 * 10.0) + (uint)!(bool)(bVar4 & 1) * (int)fVar9)
    ;
  }
  else {
LAB_00301a61:
    fVar9 = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar5 = 0;
      if (uVar8 == 8) {
        uVar5 = ImParseFormatPrecision(format,3);
      }
      auVar18._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar18._8_56_ = extraout_var_00;
      local_38 = vmovlps_avx(auVar18._0_16_);
      fVar9 = *(float *)((long)&local_38 + (ulong)(uVar7 >> 0x14) * 4);
      if ((int)uVar5 < 0) {
        auVar10 = SUB6416(ZEXT464(0x800000),0);
      }
      else if ((int)uVar5 < 10) {
        auVar10 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar5 * 4));
      }
      else {
        auVar19._0_4_ = powf(10.0,(float)(int)-uVar5);
        auVar19._4_60_ = extraout_var;
        auVar10 = auVar19._0_16_;
      }
      uVar2 = vcmpss_avx512f(auVar10,local_68,2);
      bVar4 = (bool)((byte)uVar2 & 1);
      v_speed = (float)((uint)bVar4 * (int)v_speed + (uint)!bVar4 * auVar10._0_4_);
    }
  }
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar10 = vxorps_avx512vl(ZEXT416((uint)(fVar9 * v_speed)),auVar10);
  fVar9 = (float)((uint)(uVar7 == 0) * (int)(fVar9 * v_speed) + (uint)(uVar7 != 0) * auVar10._0_4_);
  if ((((flags & 0x20U) != 0) && (dVar14 = v_max - v_min, dVar14 < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < dVar14)) {
    fVar9 = fVar9 / (float)dVar14;
  }
  if (v_min < v_max) {
    if ((*v < v_max) || (bVar4 = true, fVar9 <= 0.0)) {
      bVar4 = fVar9 < 0.0 && *v <= v_min;
    }
  }
  else {
    bVar4 = false;
  }
  if ((pIVar3->ActiveIdIsJustActivated != false) || (bVar4)) {
    pIVar3->DragCurrentAccum = 0.0;
    bVar4 = false;
  }
  else {
    if ((fVar9 == 0.0) && (!NAN(fVar9))) goto LAB_00301bee;
    pIVar3->DragCurrentAccum = fVar9 + pIVar3->DragCurrentAccum;
    bVar4 = true;
  }
  pIVar3->DragCurrentAccumDirty = bVar4;
LAB_00301bee:
  if (pIVar3->DragCurrentAccumDirty == true) {
    dVar14 = *v;
    if ((flags & 0x20U) == 0) {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar14 + (double)pIVar3->DragCurrentAccum;
      fVar13 = 0.0;
      dVar14 = 0.0;
    }
    else {
      if (uVar8 == 8) {
        iVar6 = ImParseFormatPrecision(format,3);
        fVar13 = (float)iVar6;
      }
      else {
        fVar13 = 1.0;
      }
      fVar13 = powf(0.1,fVar13);
      fVar12 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar14,v_min,v_max,true,fVar13,0.0);
      auVar20._0_8_ =
           ScaleValueFromRatioT<double,double,double>
                     (data_type,fVar12 + pIVar3->DragCurrentAccum,v_min,v_max,true,fVar13,0.0);
      auVar20._8_56_ = extraout_var_01;
      auVar15 = auVar20._0_16_;
      dVar14 = (double)fVar12;
    }
    if ((flags & 0x40U) == 0) {
      auVar21._0_8_ = RoundScalarWithFormatT<double,double>(format,data_type,auVar15._0_8_);
      auVar21._8_56_ = extraout_var_02;
      auVar15 = auVar21._0_16_;
    }
    pIVar3->DragCurrentAccumDirty = false;
    dVar23 = auVar15._0_8_;
    if ((flags & 0x20U) == 0) {
      dVar14 = dVar23 - *v;
    }
    else {
      fVar13 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar23,v_min,v_max,true,fVar13,0.0);
      dVar14 = (double)fVar13 - dVar14;
    }
    auVar22._8_8_ = 0;
    auVar22._0_8_ = v_max;
    pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (float)dVar14;
    auVar16._0_12_ = ZEXT812(0);
    auVar16._12_4_ = 0;
    uVar2 = vcmpsd_avx512f(auVar15,auVar16,0);
    dVar23 = (double)((ulong)!(bool)((byte)uVar2 & 1) * (long)dVar23);
    auVar11._8_8_ = auVar15._8_8_;
    auVar11._0_8_ = dVar23;
    dVar14 = *v;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar14;
    if (v_min < v_max) {
      if ((dVar14 != dVar23) || (NAN(dVar14) || NAN(dVar23))) {
        if ((dVar23 < v_min) || (((uVar8 != 8 && (dVar14 < dVar23)) && (fVar9 < 0.0)))) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = v_min;
        }
        if ((v_max < auVar11._0_8_) || (((uVar8 != 8 && (auVar11._0_8_ < dVar14)) && (0.0 < fVar9)))
           ) {
          auVar11 = auVar22;
        }
      }
    }
    dVar23 = auVar11._0_8_;
    if ((dVar14 != dVar23) || (NAN(dVar14) || NAN(dVar23))) {
      *v = dVar23;
      bVar4 = true;
    }
    else {
      uVar2 = vcmpsd_avx512f(auVar17,auVar11,4);
      bVar4 = (bool)((byte)uVar2 & 1);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}